

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
* parse_query_string_abi_cxx11_(string_view in_query_string)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
            (in_RDI);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)in_RDI,&local_20);
  jessilib::
  deserialize_html_form<char,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_nullptr>
            ((jessilib *)&in_RDI->second,
             (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)in_RDI,inout_string);
  return in_RDI;
}

Assistant:

std::pair<std::string, query_table_type> parse_query_string(std::string_view in_query_string) {
	std::pair<std::string, query_table_type> result;
	result.first = in_query_string;
	jessilib::deserialize_html_form(result.second, result.first);
	return result;
}